

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float *in_stack_fffffffffffffeb0;
  int _c;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  int local_140;
  int local_13c;
  float *local_120;
  float *local_118;
  float *local_110;
  Mat local_f8;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float local_9c;
  Mat local_98;
  int local_54;
  float *local_50;
  float *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RDI + 0x34);
  local_3c = local_2c * 2 + local_30 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; _c = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20), local_54 < local_38;
      local_54 = local_54 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),_c);
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffeb8 = 0.0;
    }
    else {
      in_stack_fffffffffffffeb8 = local_50[local_54];
    }
    local_a8 = local_48 + local_54 * 9;
    local_9c = in_stack_fffffffffffffeb8;
    local_b0 = Mat::operator_cast_to_float_(&local_98);
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),_c);
    in_stack_fffffffffffffeb0 = Mat::operator_cast_to_float_(&local_f8);
    Mat::~Mat((Mat *)0x1998ea);
    local_118 = in_stack_fffffffffffffeb0 + local_2c;
    local_120 = in_stack_fffffffffffffeb0 + (local_2c << 1);
    local_110 = in_stack_fffffffffffffeb0;
    for (local_13c = 0; local_13c < local_34; local_13c = local_13c + 1) {
      for (local_140 = local_30; 0 < local_140; local_140 = local_140 + -1) {
        in_stack_fffffffffffffebc =
             local_120[2] * local_a8[8] +
             local_120[1] * local_a8[7] +
             *local_120 * local_a8[6] +
             local_118[2] * local_a8[5] +
             local_118[1] * local_a8[4] +
             *local_118 * local_a8[3] +
             local_110[2] * local_a8[2] +
             local_110[1] * local_a8[1] + *local_110 * *local_a8 + local_9c;
        *local_b0 = in_stack_fffffffffffffebc;
        local_110 = local_110 + 2;
        local_118 = local_118 + 2;
        local_120 = local_120 + 2;
        local_b0 = local_b0 + 1;
      }
      local_110 = local_110 + local_3c;
      local_118 = local_118 + local_3c;
      local_120 = local_120 + local_3c;
    }
    local_b8 = in_stack_fffffffffffffeb0;
    Mat::~Mat((Mat *)0x199bb5);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }

    }
}